

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

bool_t ecpIsSafeGroup(ec_o *ec,size_t mov_threshold,void *stack)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  word *b;
  word *stack_00;
  
  sVar3 = ec->f->n;
  b = (word *)((long)stack + sVar3 * 8 + 8);
  stack_00 = b + sVar3 + 1;
  sVar3 = wwWordSize(ec->order,sVar3 + 1);
  bVar1 = priIsPrime(ec->order,sVar3,stack_00);
  if ((bVar1 != 0) && (iVar2 = wwCmp2(ec->f->mod,ec->f->n,ec->order,sVar3), iVar2 != 0)) {
    if (mov_threshold == 0) {
      return 1;
    }
    zzMod((word *)stack,ec->f->mod,ec->f->n,ec->order,sVar3,stack_00);
    wwCopy(b,(word *)stack,sVar3);
    while (iVar2 = wwCmpW(b,sVar3,1), iVar2 != 0) {
      mov_threshold = mov_threshold - 1;
      if (mov_threshold == 0) {
        return 1;
      }
      zzMulMod(b,b,(word *)stack,ec->order,sVar3,stack_00);
    }
  }
  return 0;
}

Assistant:

bool_t ecpIsSafeGroup(const ec_o* ec, size_t mov_threshold, void* stack)
{
	size_t n1 = ec->f->n + 1;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n1;
	stack = t2 + n1;
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(ecIsOperableGroup(ec));
	// order -- простое?
	n1 = wwWordSize(ec->order, n1);
	if (!priIsPrime(ec->order, n1, stack))
		return FALSE;
	// order == p?
	if (wwCmp2(ec->f->mod, ec->f->n, ec->order, n1) == 0)
		return FALSE;
	// проверка MOV
	if (mov_threshold)
	{
		zzMod(t1, ec->f->mod, ec->f->n, ec->order, n1, stack);
		wwCopy(t2, t1, n1);
		if (wwCmpW(t2, n1, 1) == 0)
			return FALSE;
		while (--mov_threshold)
		{
			zzMulMod(t2, t2, t1, ec->order, n1, stack);
			if (wwCmpW(t2, n1, 1) == 0)
				return FALSE;
		}
	}
	// все нормально
	return TRUE;
}